

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_entry.cc
# Opt level: O0

list_entry * raptor_list_pop_front(list_entry *head)

{
  list_entry *plVar1;
  list_entry *removed;
  list_entry *second;
  list_entry *head_local;
  
  if (head->next == head) {
    head_local = (list_entry *)0x0;
  }
  else {
    head_local = head->next;
    plVar1 = head_local->next;
    head->next = plVar1;
    plVar1->prev = head;
  }
  return head_local;
}

Assistant:

list_entry* raptor_list_pop_front(list_entry* head) {
    list_entry* second = 0;
    list_entry* removed = 0;
    if (RAPTOR_LIST_IS_EMPTY(head)) {
        return 0;
    }

    removed = head->next;
    second = removed->next;

    head->next = second;
    second->prev = head;
    return removed;
}